

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::write_int<unsigned__int128,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,unsigned___int128 value,basic_format_specs<char> *spec)

{
  byte bVar1;
  long in_RCX;
  undefined1 local_38 [32];
  char local_18;
  uint local_14;
  
  local_14 = 0;
  bVar1 = *(byte *)(in_RCX + 9) >> 4 & 7;
  if (1 < bVar1) {
    local_18 = ' ';
    if (bVar1 == 2) {
      local_18 = '+';
    }
    local_14 = 1;
  }
  local_38._0_8_ = this;
  local_38._16_8_ = spec;
  handle_int_type_spec<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>>
            (*(char *)(in_RCX + 8),
             (int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
  return;
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }